

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

void __thiscall libtorrent::bdecode_node::bdecode_node(bdecode_node *this,bdecode_node *n)

{
  bdecode_node *n_local;
  bdecode_node *this_local;
  
  libtorrent::aux::
  noexcept_movable<std::vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>_>
  ::noexcept_movable(&this->m_tokens,&n->m_tokens);
  this->m_root_tokens = n->m_root_tokens;
  this->m_buffer = n->m_buffer;
  this->m_buffer_size = n->m_buffer_size;
  this->m_token_idx = n->m_token_idx;
  this->m_last_index = n->m_last_index;
  this->m_last_token = n->m_last_token;
  this->m_size = n->m_size;
  operator=(this,n);
  return;
}

Assistant:

bdecode_node::bdecode_node(bdecode_node const& n)
		: m_tokens(n.m_tokens)
		, m_root_tokens(n.m_root_tokens)
		, m_buffer(n.m_buffer)
		, m_buffer_size(n.m_buffer_size)
		, m_token_idx(n.m_token_idx)
		, m_last_index(n.m_last_index)
		, m_last_token(n.m_last_token)
		, m_size(n.m_size)
	{
		(*this) = n;
	}